

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::Reset(CPU *this,uint16_t start)

{
  this->pc = start;
  this->sp = 0xff;
  this->A = '\0';
  this->X = '\0';
  this->Y = '\0';
  this->field_6 = (anon_union_1_2_fd64ec58_for_CPU_6)0x10;
  this->cycles = 0;
  return;
}

Assistant:

void CPU::Reset(uint16_t start)
{
    pc = start;
    sp = 0xFF;
    C = Z = I = D = B = V = N = 0;
    U = 1;
    A = X = Y = 0;
    cycles = 0;
}